

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

int __thiscall
TPZCompElHCurl<pzshape::TPZShapeCube>::NConnectShapeF
          (TPZCompElHCurl<pzshape::TPZShapeCube> *this,int connect,int order)

{
  int iVar1;
  
  if (this->fhcurlfam == EHCurlNoGrads) {
    iVar1 = TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::ComputeNConnectShapeF(connect,order);
    return iVar1;
  }
  if (this->fhcurlfam == EHCurlStandard) {
    iVar1 = TPZShapeHCurl<pzshape::TPZShapeCube>::ComputeNConnectShapeF(connect,order);
    return iVar1;
  }
  return -1;
}

Assistant:

int TPZCompElHCurl<TSHAPE>::NConnectShapeF(int connect, int order) const
{
    switch (fhcurlfam)
    {
    case HCurlFamily::EHCurlStandard:
        return TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(connect, order);
        break;
    case HCurlFamily::EHCurlNoGrads:
        return TPZShapeHCurlNoGrads<TSHAPE>::ComputeNConnectShapeF(connect, order);
        break;
    }/**there is no default case on purpose, because now the compiler
      will warn us if a new hcurl family is added*/
    return -1;
}